

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gettimeofday.c
# Opt level: O0

int run_test_gettimeofday(void)

{
  int iVar1;
  undefined1 auStack_18 [4];
  int r;
  uv_timeval64_t tv;
  
  _auStack_18 = 0;
  iVar1 = uv_gettimeofday((uv_timeval64_t *)auStack_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gettimeofday.c"
            ,0x1f,"r == 0");
    abort();
  }
  if (_auStack_18 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gettimeofday.c"
            ,0x20,"tv.tv_sec != 0");
    abort();
  }
  iVar1 = uv_gettimeofday((uv_timeval64_t *)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gettimeofday.c"
            ,0x24,"r == UV_EINVAL");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(gettimeofday) {
  uv_timeval64_t tv;
  int r;

  tv.tv_sec = 0;
  r = uv_gettimeofday(&tv);
  ASSERT(r == 0);
  ASSERT(tv.tv_sec != 0);

  /* Test invalid input. */
  r = uv_gettimeofday(NULL);
  ASSERT(r == UV_EINVAL);

  return 0;
}